

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanced_geometry_device.cpp
# Opt level: O0

void renderFrameStandard(int *pixels,uint width,uint height,float time,ISPCCamera *camera)

{
  kind_type relation_with_parent;
  bool bVar1;
  runtime_error *this;
  int in_EDX;
  int in_ESI;
  int numTilesY;
  int numTilesX;
  task_group_context context;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  undefined1 local_148 [4];
  task_group_context *this_00;
  anon_class_8_1_898bcfc2 *body;
  blocked_range<unsigned_long> *range;
  undefined1 local_fc [12];
  undefined1 local_f0 [8];
  undefined1 *local_e8;
  unsigned_long local_e0;
  undefined8 local_d8;
  undefined1 *local_d0;
  blocked_range<unsigned_long> local_b8 [6];
  undefined1 *local_20;
  size_type local_18;
  unsigned_long local_10;
  unsigned_long local_8;
  
  local_e0 = (unsigned_long)(int)((in_ESI + 7U >> 3) * (in_EDX + 7U >> 3));
  this_00 = (task_group_context *)(local_fc + 8);
  body = (anon_class_8_1_898bcfc2 *)(local_fc + 4);
  range = (blocked_range<unsigned_long> *)local_fc;
  local_d8 = 0;
  local_e8 = local_148;
  local_8 = 0;
  local_18 = 1;
  relation_with_parent = (kind_type)((ulong)local_f0 >> 0x20);
  _local_148 = local_f0;
  local_20 = local_e8;
  local_10 = local_e0;
  tbb::detail::d1::task_group_context::task_group_context
            (this_00,relation_with_parent,
             CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  tbb::detail::d1::blocked_range<unsigned_long>::blocked_range(local_b8,local_8,local_10,local_18);
  local_d0 = local_20;
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,renderFrameStandard::__0>(unsigned_long,unsigned_long,unsigned_long,renderFrameStandard::__0_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            (range,body,this_00);
  bVar1 = tbb::detail::d1::task_group_context::is_group_execution_cancelled
                    ((task_group_context *)0x1320b8);
  if (!bVar1) {
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)0x132160);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"task cancelled");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void renderFrameStandard (int* pixels,
                          const unsigned int width,
                          const unsigned int height,
                          const float time,
                          const ISPCCamera& camera)
{
  /* render all pixels */
#if defined(EMBREE_SYCL_TUTORIAL) && !defined(EMBREE_SYCL_RT_SIMULATION)
  TutorialData ldata = data;
  sycl::event event = global_gpu_queue->submit([=](sycl::handler& cgh){
    const sycl::nd_range<2> nd_range = make_nd_range(height,width);
    cgh.parallel_for(nd_range,[=](sycl::nd_item<2> item) {
      const unsigned int x = item.get_global_id(1); if (x >= width ) return;
      const unsigned int y = item.get_global_id(0); if (y >= height) return;
      RayStats stats;
      renderPixelStandard(ldata,x,y,pixels,width,height,time,camera,stats);
    });
  });
  global_gpu_queue->wait_and_throw();

  const auto t0 = event.template get_profiling_info<sycl::info::event_profiling::command_start>();
  const auto t1 = event.template get_profiling_info<sycl::info::event_profiling::command_end>();
  const double dt = (t1-t0)*1E-9;
  ((ISPCCamera*)&camera)->render_time = dt;
  
#else
  const int numTilesX = (width +TILE_SIZE_X-1)/TILE_SIZE_X;
  const int numTilesY = (height+TILE_SIZE_Y-1)/TILE_SIZE_Y;
  parallel_for(size_t(0),size_t(numTilesX*numTilesY),[&](const range<size_t>& range) {
    const int threadIndex = (int)TaskScheduler::threadIndex();
    for (size_t i=range.begin(); i<range.end(); i++)
      renderTileTask((int)i,threadIndex,pixels,width,height,time,camera,numTilesX,numTilesY);
  }); 
#endif
}